

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O2

bool __thiscall
TestClass::SyncRetFunc10
          (TestClass *this,uint64_t *p1,uint32_t p2,uint16_t *p3,CopyCounterGuy *ccg1,uint8_t *p4,
          int64_t *p5,int32_t *p6,int16_t *p7,int8_t *p8,bool *p9)

{
  char cVar1;
  SyncRetEventAgent<bool> *this_00;
  ssize_t sVar2;
  void *__buf;
  int __flags;
  
  __flags = (int)ccg1;
  cVar1 = EventDispatcher::isThreadCurrent();
  if (cVar1 != '\0') {
    *p1 = *p1 + 0x400;
    *p3 = *p3 + 0x100;
    *p4 = *p4 + '\x10';
    *p5 = *p5 + -0x400;
    *p6 = *p6 + -0x200;
    *p7 = *p7 + -0x100;
    *p8 = *p8 + -0x10;
    *p9 = (bool)(*p9 ^ 1);
    return true;
  }
  this_00 = (SyncRetEventAgent<bool> *)
            operator_new(0x80,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                         ,0x1c9);
  *(undefined8 *)&this_00->field_0x8 = 0xfffffffb00000000;
  *(undefined4 *)&this_00->field_0x10 = 0;
  *(undefined ***)this_00 = &PTR_onRefCountZero_00110d60;
  *(TestClass **)(this_00 + 1) = this;
  *(code **)&this_00[1].field_0x8 = SyncRetFunc10;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  *(uint64_t **)(this_00 + 2) = p1;
  *(uint32_t *)&this_00[2].field_0x8 = p2;
  *(uint16_t **)&this_00[2].field_0x10 = p3;
  *(CopyCounterGuy **)(this_00 + 3) = ccg1;
  *(uint8_t **)&this_00[3].field_0x8 = p4;
  *(int64_t **)&this_00[3].field_0x10 = p5;
  *(int32_t **)(this_00 + 4) = p6;
  *(int16_t **)&this_00[4].field_0x8 = p7;
  *(int8_t **)&this_00[4].field_0x10 = p8;
  *(bool **)(this_00 + 5) = p9;
  sVar2 = SyncRetEventAgent<bool>::send(this_00,(int)this + 8,__buf,(size_t)p9,__flags);
  return SUB81(sVar2,0);
}

Assistant:

bool SyncRetFunc10(uint64_t& p1, uint32_t p2, uint16_t& p3, CopyCounterGuy& ccg1, uint8_t& p4, int64_t& p5, int32_t &p6, int16_t &p7, int8_t& p8, bool& p9)
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result;
			SyncRetEventAgent10<TestClass, bool, uint64_t &, uint32_t, uint16_t &, CopyCounterGuy &, uint8_t &, int64_t&, int32_t&, int16_t&, int8_t&, bool&>* agent =
				jh_new SyncRetEventAgent10<TestClass, bool, uint64_t &, uint32_t, uint16_t &, CopyCounterGuy &, uint8_t&, int64_t&, int32_t&, int16_t&, int8_t&, bool&>(this, &TestClass::SyncRetFunc10,
				p1, p2, p3, ccg1, p4, p5, p6, p7, p8, p9);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu) p2(%u) p3(%u) ccg1(%d) p4(%u) p5(%lld) p6(%d) p7(%d) p8(%d) p9(%d)", result, p1, p2, p3, ccg1.getCount(), p4, p5, p6, p7, p8, p9);
			return result;
		}
		
		LOG_INFO("Received p1(%llu) p2(%u) p3(%u) ccg1(%d) p4(%u) p5(%lld) p6(%d) p7(%d) p8(%d) p9(%d)", p1, p2, p3, ccg1.getCount(), p4, p5, p6, p7, p8, p9);
		p1+=1024;
		p2+=512;
		p3+=256;
		p4+=16;
		p5-=1024;
		p6-=512;
		p7-=256;
		p8-=16;
		p9=!p9;
		return true;
	}